

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void small_suite::run(void)

{
  undefined4 local_c;
  undefined8 local_8;
  
  test_zero();
  test_one();
  test_minus_one();
  test_lower();
  test_upper();
  local_8 = 0;
  local_c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(std::int8_t(0))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x93,"void small_suite::fail_empty()",&local_8,&local_c);
  return;
}

Assistant:

void run()
{
    test_zero();
    test_one();
    test_minus_one();
    test_lower();
    test_upper();
    fail_empty();
}